

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O0

message_order * __thiscall FIX::DataDictionary::getTrailerOrderedFields(DataDictionary *this)

{
  bool bVar1;
  size_type sVar2;
  ConfigError *this_00;
  int *order;
  message_order local_70;
  undefined1 local_4d;
  allocator<char> local_39;
  string local_38;
  DataDictionary *local_18;
  DataDictionary *this_local;
  
  local_18 = this;
  bVar1 = message_order::operator_cast_to_bool(&this->m_trailerOrder);
  if (bVar1) {
    this_local = (DataDictionary *)&this->m_trailerOrder;
  }
  else {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->m_trailerOrderedFields);
    if (sVar2 == 0) {
      local_4d = 1;
      this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"<Trailer> does not have a stored message order",&local_39);
      ConfigError::ConfigError(this_00,&local_38);
      local_4d = 0;
      __cxa_throw(this_00,&ConfigError::typeinfo,ConfigError::~ConfigError);
    }
    order = std::vector<int,_std::allocator<int>_>::data(&this->m_trailerOrderedFields);
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->m_trailerOrderedFields);
    message_order::message_order(&local_70,order,(int)sVar2);
    this_local = (DataDictionary *)message_order::operator=(&this->m_trailerOrder,&local_70);
    message_order::~message_order(&local_70);
  }
  return (message_order *)this_local;
}

Assistant:

EXCEPT(ConfigError) {
  if (m_trailerOrder) {
    return m_trailerOrder;
  }

  if (m_trailerOrderedFields.size() == 0) {
    throw ConfigError("<Trailer> does not have a stored message order");
  }

  return m_trailerOrder = message_order(m_trailerOrderedFields.data(), m_trailerOrderedFields.size());
}